

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
 __thiscall
ninx::parser::Parser::parse_sub_expression
          (Parser *this,
          function<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_()>
          *term_parser,
          vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
          *operators)

{
  string *psVar1;
  undefined1 auVar2 [8];
  _Manager_type p_Var3;
  int iVar4;
  undefined8 *in_RCX;
  pointer *__ptr;
  string *sequence;
  int i;
  ulong uVar5;
  undefined8 uVar6;
  _Head_base<0UL,_ninx::parser::element::Expression_*,_false> local_60;
  undefined1 local_58 [8];
  function<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_()>
  local_50;
  
  local_50.super__Function_base._M_functor._8_8_ = operators;
  local_50.super__Function_base._M_manager = (_Manager_type)this;
  std::
  function<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_()>
  ::operator()(&local_50);
  uVar6 = local_50.super__Function_base._M_functor._M_unused._0_8_;
  local_50.super__Function_base._M_functor._M_unused._M_object = (long *)0x0;
  do {
    sequence = (string *)*in_RCX;
    psVar1 = (string *)in_RCX[1];
    while( true ) {
      if (sequence == psVar1) goto LAB_00120af4;
      iVar4 = TokenReader::check_limiter_sequence((TokenReader *)(term_parser + 1),sequence);
      if (iVar4 == 1) break;
      sequence = sequence + 2;
    }
    for (uVar5 = 0; uVar5 < sequence->_M_string_length; uVar5 = uVar5 + 1) {
      TokenReader::get_token((TokenReader *)(term_parser + 1));
    }
    std::
    function<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_()>
    ::operator()((function<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_()>
                  *)local_58);
    auVar2 = local_58;
    local_58 = (undefined1  [8])0x0;
    local_60._M_head_impl = (Expression *)uVar6;
    std::
    function<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_(std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>,_std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>)>
    ::operator()((function<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_(std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>,_std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>)>
                  *)&local_50._M_invoker,
                 (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                  *)(sequence + 1),
                 (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                  *)&local_60);
    if (auVar2 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)auVar2 + 8))();
    }
    if (local_60._M_head_impl != (Expression *)0x0) {
      (*((local_60._M_head_impl)->super_Statement).super_ASTElement._vptr_ASTElement[1])();
    }
    uVar6 = local_50._M_invoker;
    local_60._M_head_impl = (Expression *)0x0;
    if (local_58 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_58 + 8))();
    }
  } while (sequence != psVar1);
LAB_00120af4:
  p_Var3 = local_50.super__Function_base._M_manager;
  (((Statement *)local_50.super__Function_base._M_manager)->super_ASTElement)._vptr_ASTElement =
       (_func_int **)uVar6;
  if ((long *)local_50.super__Function_base._M_functor._M_unused._0_8_ != (long *)0x0) {
    (**(code **)(*local_50.super__Function_base._M_functor._M_unused._M_object + 8))();
  }
  return (__uniq_ptr_data<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>,_true,_true>
            )p_Var3;
}

Assistant:

std::unique_ptr<Expression>
ninx::parser::Parser::parse_sub_expression(std::function<std::unique_ptr<Expression>()> term_parser,
                                           std::vector<ninx::parser::OperatorCaseDefinition> operators) {
    std::unique_ptr<Expression> expression{nullptr};

    auto first{term_parser()};
    expression = std::move(first);

    while (true) {
        bool found{false};

        for (auto &case_def : operators) {
            if (reader.check_limiter_sequence(case_def.op) == 1) {
                // Remove the tokens
                for (int i = 0; i<case_def.op.length(); i++) {
                    reader.get_token();
                }

                auto second{term_parser()};

                auto sub_expr = case_def.builder(std::move(expression), std::move(second));
                expression = std::move(sub_expr);

                found = true;
                break;
            }
        }

        if (!found) {
            break;
        }
    }

    return std::move(expression);
}